

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.h
# Opt level: O3

ostream * wavingz::zwave_print<unsigned_char*>(ostream *out,uchar *data_begin,uchar *data_end)

{
  long lVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  ulong uVar3;
  ostream *poVar4;
  byte bVar5;
  byte *pbVar6;
  long lVar7;
  char *pcVar8;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (data_begin != data_end) {
    pbVar6 = data_begin;
    do {
      lVar7 = *(long *)out;
      *(uint *)(out + *(long *)(lVar7 + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(lVar7 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar2 = out + *(long *)(lVar7 + -0x18);
      if (out[*(long *)(lVar7 + -0x18) + 0xe1] == (ostream)0x0) {
        std::ios::widen((char)poVar2);
        poVar2[0xe1] = (ostream)0x1;
        lVar7 = *(long *)out;
      }
      poVar2[0xe0] = (ostream)0x30;
      *(undefined8 *)(out + *(long *)(lVar7 + -0x18) + 0x10) = 2;
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,(uint)*pbVar6);
      uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)((long)&uStack_38 + 7),1);
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != data_end);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  if (data_begin != (uchar *)0x0) {
    uVar3 = (ulong)data_begin[7];
    if ((9 < (ulong)((long)data_end - (long)data_begin) && uVar3 != 0) &&
       (uVar3 <= (ulong)((long)data_end - (long)data_begin))) {
      if (data_begin + (uVar3 - 1) == data_begin) {
        bVar5 = 0xff;
      }
      else {
        bVar5 = 0xff;
        lVar7 = 0;
        do {
          bVar5 = bVar5 ^ data_begin[lVar7];
          lVar7 = lVar7 + 1;
        } while (uVar3 - 1 != lVar7);
      }
      pcVar8 = "[ ] ";
      if (bVar5 == data_begin[uVar3 - 1]) {
        pcVar8 = "[x] ";
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,pcVar8,4);
      lVar7 = *(long *)out;
      *(uint *)(out + *(long *)(lVar7 + -0x18) + 0x18) =
           *(uint *)(out + *(long *)(lVar7 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar2 = out + *(long *)(lVar7 + -0x18);
      if (out[*(long *)(lVar7 + -0x18) + 0xe1] == (ostream)0x0) {
        std::ios::widen((char)poVar2);
        poVar2[0xe1] = (ostream)0x1;
        lVar7 = *(long *)out;
      }
      poVar2[0xe0] = (ostream)0x30;
      *(undefined8 *)(out + *(long *)(lVar7 + -0x18) + 0x10) = 2;
      std::__ostream_insert<char,std::char_traits<char>>(out,"HomeId: ",8);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", SourceNodeId: ",0x10);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(uint)data_begin[4]);
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", FC0: ",7);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(uint)data_begin[5]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", FC1: ",7);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(uint)data_begin[6]);
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", FC[speed=",0xb);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," low_power=",0xb);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ack_request=",0xd);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," header_type=",0xd);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," beaming_info=",0xe);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," seq=",5);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"], Length: ",0xb);
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(uint)data_begin[7]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", DestNodeId: ",0xe);
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(uint)data_begin[8]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", CommandClass: ",0x10);
      *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(uint)data_begin[9]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Payload: ",0xb);
      lVar7 = *(long *)poVar4;
      lVar1 = *(long *)(lVar7 + -0x18);
      *(uint *)(poVar4 + lVar1 + 0x18) = *(uint *)(poVar4 + lVar1 + 0x18) & 0xffffffb5 | 8;
      lVar7 = *(long *)(lVar7 + -0x18);
      poVar2 = poVar4 + lVar7;
      if (poVar4[lVar7 + 0xe1] == (ostream)0x0) {
        std::ios::widen((char)poVar2);
        poVar2[0xe1] = (ostream)0x1;
      }
      poVar2[0xe0] = (ostream)0x30;
      if (data_begin[7] < 0xc) {
        return out;
      }
      lVar7 = 10;
      do {
        *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 2;
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,(uint)data_begin[lVar7]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
        lVar7 = lVar7 + 1;
      } while (lVar7 < (long)((ulong)data_begin[7] - 1));
      return out;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"[ ] ",4);
  return out;
}

Assistant:

inline std::ostream&
zwave_print(std::ostream& out, It data_begin, It data_end)
{
    for(auto ch = data_begin; ch != data_end; ++ch)
        out << std::hex << std::setfill('0') << std::setw(2) << (int)*ch << ' ';
    out << std::endl;

    size_t len = data_end - data_begin;
    packet_t& p = *(packet_t*)data_begin;
    if (data_begin == 0 || p.length == 0 || len < sizeof(packet_t) || len < p.length)
    {
        out << "[ ] ";
        return out;
    }
    else if (checksum(data_begin, data_begin + (size_t)p.length - 1) !=
             data_begin[p.length - 1])
    {
        out << "[ ] ";
    }
    else
    {
        out << "[x] ";
    }
    out << std::hex << std::setfill('0') << std::setw(2)
        << "HomeId: " << ((uint32_t)p.home_id3 | p.home_id2 << 8 |
                          p.home_id1 << 16 | p.home_id0 << 24)
        << ", SourceNodeId: " << (int)p.source_node_id << std::hex
        << ", FC0: " << (int)p.fc0 << ", FC1: " << (int)p.fc1 << std::dec
        << ", FC[speed=" << p.frame_control_0.speed
        << " low_power=" << p.frame_control_0.low_power
        << " ack_request=" << p.frame_control_0.ack_request
        << " header_type=" << p.frame_control_0.header_type
        << " beaming_info=" << p.frame_control_1.beaming_info
        << " seq=" << p.frame_control_1.sequence_number
        << "], Length: " << std::dec << (int)p.length
        << ", DestNodeId: " << std::dec << (int)p.dest_node_id
        << ", CommandClass: " << std::hex << (int)p.command_class
        << ", Payload: " << std::hex << std::setfill('0');
    for (int i = sizeof(packet_t); i < p.length - 1; i++) {
        out << std::setw(2) << (int)data_begin[i] << " ";
    }
    return out;
}